

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_2tap_8x2_avx2(int16_t *src,__m128i *s_128,__m256i *coeffs,__m256i *r)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  __m256i s1;
  __m256i s0;
  __m256i *in_RDX;
  __m256i *in_RSI;
  long in_RDI;
  __m256i s_256 [2];
  longlong in_stack_ffffffffffffffd0;
  
  lVar1 = *(longlong *)(in_RDI + 0x18);
  (*in_RSI)[2] = *(longlong *)(in_RDI + 0x10);
  (*in_RSI)[3] = lVar1;
  lVar1 = (*in_RSI)[0];
  lVar2 = (*in_RSI)[1];
  lVar3 = *(longlong *)(in_RDI + 0x28);
  (*in_RSI)[0] = *(longlong *)(in_RDI + 0x20);
  (*in_RSI)[1] = lVar3;
  s0[1] = (longlong)(in_RDI + 0x20);
  s0[0] = lVar2;
  s0[2] = (longlong)(in_RDI + 0x10);
  s0[3] = in_stack_ffffffffffffffd0;
  s1[1] = (*in_RSI)[2];
  s1[0] = in_RDI;
  s1[2] = (*in_RSI)[3];
  s1[3] = lVar1;
  xy_y_convolve_2tap_16_avx2(s0,s1,in_RSI,in_RDX);
  return;
}

Assistant:

static inline void xy_y_convolve_2tap_8x2_avx2(const int16_t *const src,
                                               __m128i s_128[2],
                                               const __m256i coeffs[1],
                                               __m256i r[2]) {
  __m256i s_256[2];
  s_128[1] = _mm_loadu_si128((__m128i *)(src + 8));
  s_256[0] = _mm256_setr_m128i(s_128[0], s_128[1]);
  s_128[0] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
  s_256[1] = _mm256_setr_m128i(s_128[1], s_128[0]);
  xy_y_convolve_2tap_16_avx2(s_256[0], s_256[1], coeffs, r);
}